

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O0

void Gia_ManIllustrateBoxes(Gia_Man_t *p)

{
  Tim_Man_t *p_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  Gia_Obj_t *pGVar6;
  Gia_Obj_t *pObj;
  int nBoxOuts;
  int nBoxIns;
  int curCo;
  int curCi;
  int k;
  int i;
  int nBoxes;
  Tim_Man_t *pManTime;
  Gia_Man_t *p_local;
  
  p_00 = (Tim_Man_t *)p->pManTime;
  iVar1 = Tim_ManBoxNum(p_00);
  nBoxIns = Tim_ManPiNum(p_00);
  nBoxOuts = 0;
  for (curCi = 0; curCi < iVar1; curCi = curCi + 1) {
    uVar2 = Tim_ManBoxInputNum(p_00,curCi);
    uVar3 = Tim_ManBoxOutputNum(p_00,curCi);
    printf("Box %4d  [%d x %d] :   ",(ulong)(uint)curCi,(ulong)uVar2,(ulong)uVar3);
    printf("Input obj IDs = ");
    for (curCo = 0; curCo < (int)uVar2; curCo = curCo + 1) {
      pGVar6 = Gia_ManCo(p,nBoxOuts + curCo);
      uVar4 = Gia_ObjId(p,pGVar6);
      printf("%d ",(ulong)uVar4);
    }
    printf("  Output obj IDs = ");
    for (curCo = 0; curCo < (int)uVar3; curCo = curCo + 1) {
      pGVar6 = Gia_ManCi(p,nBoxIns + curCo);
      uVar4 = Gia_ObjId(p,pGVar6);
      printf("%d ",(ulong)uVar4);
    }
    nBoxOuts = uVar2 + nBoxOuts;
    nBoxIns = uVar3 + nBoxIns;
    printf("\n");
  }
  iVar1 = Tim_ManPoNum(p_00);
  iVar5 = Gia_ManCiNum(p);
  if (nBoxIns == iVar5) {
    iVar5 = Gia_ManCoNum(p);
    if (iVar1 + nBoxOuts == iVar5) {
      return;
    }
    __assert_fail("curCo == Gia_ManCoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                  ,0xad,"void Gia_ManIllustrateBoxes(Gia_Man_t *)");
  }
  __assert_fail("curCi == Gia_ManCiNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                ,0xac,"void Gia_ManIllustrateBoxes(Gia_Man_t *)");
}

Assistant:

void Gia_ManIllustrateBoxes( Gia_Man_t * p )
{
    Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
    int nBoxes = Tim_ManBoxNum( pManTime );
    int i, k, curCi, curCo, nBoxIns, nBoxOuts;
    Gia_Obj_t * pObj;
    // walk through the boxes
    curCi = Tim_ManPiNum(pManTime);
    curCo = 0;
    for ( i = 0; i < nBoxes; i++ )
    {
        nBoxIns = Tim_ManBoxInputNum(pManTime, i);
        nBoxOuts = Tim_ManBoxOutputNum(pManTime, i);
        printf( "Box %4d  [%d x %d] :   ", i, nBoxIns, nBoxOuts );
        printf( "Input obj IDs = " );
        for ( k = 0; k < nBoxIns; k++ )
        {
            pObj = Gia_ManCo( p, curCo + k );
            printf( "%d ", Gia_ObjId(p, pObj) );
        }
        printf( "  Output obj IDs = " );
        for ( k = 0; k < nBoxOuts; k++ )
        {
            pObj = Gia_ManCi( p, curCi + k );
            printf( "%d ", Gia_ObjId(p, pObj) );
        }
        curCo += nBoxIns;
        curCi += nBoxOuts;
        printf( "\n" );
    }
    curCo += Tim_ManPoNum(pManTime);
    // verify counts
    assert( curCi == Gia_ManCiNum(p) );
    assert( curCo == Gia_ManCoNum(p) );
}